

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O1

void __thiscall tst_qpromise_convert::fulfillTAsQVariant(tst_qpromise_convert *this)

{
  long *plVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QVariant>_> QVar3;
  PromiseResolver<QVariant> PVar4;
  _func_int **pp_Var5;
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *pPVar6;
  bool bVar7;
  char cVar8;
  char *pcVar9;
  char *pcVar10;
  PromiseData<QVariant> *pPVar11;
  PrivateShared *pPVar12;
  QMetaType QVar13;
  QMetaType in_stack_fffffffffffffee8;
  QPromise<QVariant> p_1;
  PromiseResolver<QVariant> resolver;
  QPromise<QVariant> p;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  code *local_b8;
  QVariant value;
  undefined1 local_78 [24];
  _Invoker_type p_Stack_60;
  _func_int **local_58;
  undefined **local_50;
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *local_48;
  Foo local_3c;
  _func_int **local_38;
  
  local_78._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)local_d8,(int *)local_78);
  QtPromise::QPromise<int>::convert<QVariant>((QPromise<int> *)&p);
  local_d8._0_8_ = &PTR__QPromiseBase_0014f0e0;
  if ((long *)local_d8._8_8_ != (long *)0x0) {
    LOCK();
    plVar1 = (long *)(local_d8._8_8_ + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    UNLOCK();
    if ((*(int *)plVar1 == 0) && ((long *)local_d8._8_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_d8._8_8_ + 8))();
    }
  }
  local_78._0_8_ = (PrivateShared *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  p_Stack_60 = (_Invoker_type)0x2;
  waitForValue<QVariant>((QVariant *)local_d8,&p,(QVariant *)local_78);
  QVariant::QVariant(&value,0x2a);
  bVar7 = (bool)QVariant::equals((QVariant *)local_d8);
  pcVar9 = QTest::toString<QVariant>((QVariant *)local_d8);
  pcVar10 = QTest::toString<QVariant>(&value);
  cVar8 = QTest::compare_helper
                    (bVar7,"Compared values are not the same",pcVar9,pcVar10,
                     "waitForValue(p, QVariant{})","QVariant{42}",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                     ,0xaf);
  QVariant::~QVariant(&value);
  QVariant::~QVariant((QVariant *)local_d8);
  QVariant::~QVariant((QVariant *)local_78);
  QVar3 = p.super_QPromiseBase<QVariant>.m_d;
  if (cVar8 == '\0') {
    cVar8 = '\0';
  }
  else {
    bVar7 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isPending
                      (&(p.super_QPromiseBase<QVariant>.m_d.d)->
                        super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
    cVar8 = QTest::qVerify((bool)(~bVar7 & ((QVar3.d)->
                                           super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)
                                           .m_error.m_data._M_exception_object == (void *)0x0),
                           "p.isFulfilled()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0xb0);
  }
  p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f1a0;
  if (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QVariant>.m_d.d)->
              super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
      (*((p.super_QPromiseBase<QVariant>.m_d.d)->
        super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (cVar8 != '\0') {
    local_3c.m_foo = 0x2a;
    QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_50,&local_3c);
    value.d.data.shared = (PrivateShared *)0x0;
    value.d.data._8_8_ = 0;
    value.d._24_8_ =
         std::
         _Function_handler<QVariant_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:605:16)>
         ::_M_invoke;
    value.d.data._16_8_ =
         std::
         _Function_handler<QVariant_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:605:16)>
         ::_M_manager;
    p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f1a0;
    pPVar11 = (PromiseData<QVariant> *)operator_new(0x68);
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData = 0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (pPVar11->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.size = 0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.size = 0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.d = (Data *)0x0
    ;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.d = (Data *)0x0
    ;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    *(undefined8 *)&(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_settled =
         0;
    (pPVar11->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseDataBase_0014f968;
    QReadWriteLock::QReadWriteLock
              (&(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_lock,0);
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_settled = false;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.d = (Data *)0x0
    ;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_handlers.d.size = 0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.d = (Data *)0x0
    ;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_catchers.d.size = 0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase =
         (_func_int **)&PTR__PromiseData_0014f900;
    (pPVar11->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar11->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LOCK();
    pQVar2 = &(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar11 != (PromiseData<QVariant> *)0x0) {
      LOCK();
      pQVar2 = &(pPVar11->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).
                super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f8c8;
    p_1.super_QPromiseBase<QVariant>.m_d.d = pPVar11;
    p.super_QPromiseBase<QVariant>.m_d.d = pPVar11;
    QtPromisePrivate::PromiseResolver<QVariant>::PromiseResolver(&resolver,&p);
    local_38 = (_func_int **)&PTR__QPromiseBase_0014f8c8;
    p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f1a0;
    if (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0) {
      LOCK();
      pQVar2 = &((p.super_QPromiseBase<QVariant>.m_d.d)->
                super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
        (*((p.super_QPromiseBase<QVariant>.m_d.d)->
          super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    pPVar6 = local_48;
    PVar4.m_d.d = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_d8._0_8_ = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_d8._8_8_ = resolver.m_d.d;
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
    }
    local_58 = (_func_int **)&PTR__QPromiseBase_0014f1a0;
    std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)local_c8,
               (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)&value);
    local_78._16_8_ = 0;
    p_Stack_60 = (_Invoker_type)0x0;
    local_78._0_8_ = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    pPVar12 = (PrivateShared *)operator_new(0x30);
    *(undefined8 *)pPVar12 = local_d8._0_8_;
    if ((Data *)local_d8._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_d8._0_8_ = *(int *)local_d8._0_8_ + 1;
      UNLOCK();
    }
    *(undefined8 *)(pPVar12 + 8) = local_d8._8_8_;
    if ((Data *)local_d8._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + 1;
      UNLOCK();
    }
    std::function<QVariant_(const_(anonymous_namespace)::Foo_&)>::function
              ((function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)(pPVar12 + 0x10),
               (function<QVariant_(const_(anonymous_namespace)::Foo_&)> *)local_c8);
    p_Stack_60 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78._16_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    local_78._0_8_ = pPVar12;
    if (local_b8 != (code *)0x0) {
      (*local_b8)((_Any_data *)local_c8,(_Any_data *)local_c8,__destroy_functor);
    }
    if ((Data *)local_d8._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
      UNLOCK();
      if ((*(int *)local_d8._8_8_ == 0) && ((Data *)local_d8._8_8_ != (Data *)0x0)) {
        operator_delete((void *)local_d8._8_8_,0x10);
      }
    }
    if ((Data *)local_d8._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_d8._0_8_ = *(int *)local_d8._0_8_ + -1;
      UNLOCK();
      if ((*(int *)local_d8._0_8_ == 0) && ((Data *)local_d8._0_8_ != (Data *)0x0)) {
        operator_delete((void *)local_d8._0_8_,0x10);
      }
    }
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addHandler(pPVar6,(function<void_(const_(anonymous_namespace)::Foo_&)> *)local_78);
    if ((code *)local_78._16_8_ != (code *)0x0) {
      (*(code *)local_78._16_8_)(local_78,local_78,3);
    }
    pPVar6 = local_48;
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
    }
    local_c8._0_8_ = (void *)0x0;
    local_c8._8_8_ = 0;
    local_d8._0_8_ = (PrivateShared *)0x0;
    local_d8._8_8_ = 0;
    local_d8._0_8_ = operator_new(8);
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QVariant>::Data> *)
     local_d8._0_8_ = PVar4.m_d.d;
    if (PVar4.m_d.d == (Data *)0x0) {
      local_c8._8_8_ =
           std::
           _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
           ::_M_manager;
    }
    else {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
      UNLOCK();
      local_c8._8_8_ =
           std::
           _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
           ::_M_manager;
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    addCatcher(pPVar6,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_d8);
    if ((code *)local_c8._0_8_ != (code *)0x0) {
      (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (PVar4.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar4.m_d.d == 0) {
        operator_delete((void *)PVar4.m_d.d,0x10);
      }
    }
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
        operator_delete((void *)resolver.m_d.d,0x10);
      }
    }
    pPVar6 = local_48;
    p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = local_38;
    bVar7 = QtPromisePrivate::
            PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
            isPending(local_48);
    if (!bVar7) {
      QtPromisePrivate::
      PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
      dispatch(pPVar6);
    }
    if (value.d.data._16_8_ != 0) {
      (*(code *)value.d.data._16_8_)(&value,&value,3);
    }
    local_50 = &PTR__QPromiseBase_0014e340;
    LOCK();
    pQVar2 = &pPVar6->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_48 !=
        (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)> *)
        0x0)) {
      (*local_48->_vptr_PromiseDataBase[1])();
    }
    p.super_QPromiseBase<QVariant>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<QVariant>.m_d.d = (PromiseData<QVariant> *)0x0;
    waitForValue<QVariant>(&value,&p_1,(QVariant *)&p);
    QVariant::~QVariant((QVariant *)&p);
    local_50 = (undefined **)CONCAT44(local_50._4_4_,0x2a);
    QVariant::QVariant((QVariant *)&p,(QMetaType)0x1503f0,&local_50);
    bVar7 = (bool)QVariant::equals(&value);
    pPVar12 = (PrivateShared *)&value;
    pcVar9 = QTest::toString<QVariant>((QVariant *)pPVar12);
    pcVar10 = QTest::toString<QVariant>((QVariant *)&p);
    cVar8 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar9,pcVar10,"value",
                       "QVariant::fromValue(Foo{42})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0xba);
    QVariant::~QVariant((QVariant *)&p);
    pp_Var5 = local_58;
    if (cVar8 != '\0') {
      bVar7 = operator==(in_stack_fffffffffffffee8,(QMetaType)0x10ec29);
      if (bVar7) {
        if ((value.d._24_8_ & 1) != 0) {
          pPVar12 = value.d.data.shared + *(int *)(value.d.data.shared + 4);
        }
        p.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
             (_func_int **)
             CONCAT44(p.super_QPromiseBase<QVariant>._vptr_QPromiseBase._4_4_,*(undefined4 *)pPVar12
                     );
      }
      else {
        p.super_QPromiseBase<QVariant>._vptr_QPromiseBase =
             (_func_int **)
             CONCAT44(p.super_QPromiseBase<QVariant>._vptr_QPromiseBase._4_4_,0xffffffff);
        pPVar12 = (PrivateShared *)&value;
        QVar13.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        if ((value.d._24_8_ & 1) != 0) {
          pPVar12 = value.d.data.shared + *(int *)(value.d.data.shared + 4);
        }
        QMetaType::convert(QVar13,pPVar12,(QMetaType)0x1503f0,&p);
      }
      cVar8 = QTest::qCompare((int)p.super_QPromiseBase<QVariant>._vptr_QPromiseBase,0x2a,
                              "value.value<Foo>().m_foo","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                              ,0xbb);
      QVar3 = p_1.super_QPromiseBase<QVariant>.m_d;
      if (cVar8 != '\0') {
        bVar7 = QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::isPending
                          (&(p_1.super_QPromiseBase<QVariant>.m_d.d)->
                            super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
        QTest::qVerify((bool)(~bVar7 & ((QVar3.d)->
                                       super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).
                                       m_error.m_data._M_exception_object == (void *)0x0),
                       "p.isFulfilled()","",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0xbc);
      }
    }
    QVariant::~QVariant(&value);
    p_1.super_QPromiseBase<QVariant>._vptr_QPromiseBase = pp_Var5;
    if (p_1.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0) {
      LOCK();
      pQVar2 = &((p_1.super_QPromiseBase<QVariant>.m_d.d)->
                super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p_1.super_QPromiseBase<QVariant>.m_d.d != (PromiseData<QVariant> *)0x0)) {
        (*((p_1.super_QPromiseBase<QVariant>.m_d.d)->
          super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsQVariant()
{
    // Primitive type to QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QCOMPARE(waitForValue(p, QVariant{}), QVariant{42});
        QVERIFY(p.isFulfilled());
    }

    // Non-Qt user-defined type to QVariant.
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QVariant>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVariant>>::value));

        QVariant value = waitForValue(p, QVariant{});
        QCOMPARE(value, QVariant::fromValue(Foo{42}));
        QCOMPARE(value.value<Foo>().m_foo, 42);
        QVERIFY(p.isFulfilled());
    }
}